

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaCuFunc.cpp
# Opt level: O1

void __thiscall NaCustomFunc::Save(NaCustomFunc *this,NaDataStream *ds)

{
  NaReal NVar1;
  uint uVar2;
  uint uVar3;
  NaReal *pNVar4;
  char *__s;
  size_t sVar5;
  NaVector *this_00;
  
  if (this->szFile != (char *)0x0) {
    NaDataStream::PutF(ds,(char *)0x0,"file    %s");
  }
  if (this->szOptions != (char *)0x0) {
    NaDataStream::PutF(ds,(char *)0x0,"options %s");
  }
  this_00 = &this->vInitial;
  uVar2 = NaVector::dim(this_00);
  if (uVar2 == 0) {
    return;
  }
  if (uVar2 == 2) {
    pNVar4 = NaVector::operator[](this_00,0);
    NVar1 = *pNVar4;
    pNVar4 = NaVector::operator[](this_00,1);
    NaDataStream::PutF(ds,(char *)0x0,"initial %g %g",NVar1,*pNVar4);
    return;
  }
  if (uVar2 == 1) {
    pNVar4 = NaVector::operator[](this_00,0);
    NaDataStream::PutF(ds,(char *)0x0,"initial %g",*pNVar4);
    return;
  }
  uVar2 = NaVector::dim(this_00);
  __s = (char *)operator_new__((ulong)(uVar2 * 0x1e + 8));
  builtin_strncpy(__s,"initial",8);
  uVar2 = NaVector::dim(this_00);
  if (uVar2 != 0) {
    uVar2 = 0;
    do {
      sVar5 = strlen(__s);
      pNVar4 = NaVector::operator[](this_00,uVar2);
      sprintf(__s + sVar5," %g",*pNVar4);
      uVar2 = uVar2 + 1;
      uVar3 = NaVector::dim(this_00);
    } while (uVar2 < uVar3);
  }
  NaDataStream::PutF(ds,(char *)0x0,"%s",__s);
  operator_delete__(__s);
  return;
}

Assistant:

void
NaCustomFunc::Save (NaDataStream& ds)
{
  if(NULL != szFile)
    ds.PutF(NULL, "file    %s", szFile);
  if(NULL != szOptions)
    ds.PutF(NULL, "options %s", szOptions);

  switch(vInitial.dim()){
  case 0:
    // nothing
    break;

  case 1:
    // economic mode
    ds.PutF(NULL, "initial %g", vInitial[0]);
    break;

  case 2:
    // economic mode
    ds.PutF(NULL, "initial %g %g", vInitial[0], vInitial[1]);
    break;

  default:
    // expensive mode
    {
      char	*buffer = new char[8 + vInitial.dim() * 30];
      unsigned	i;
      strcpy(buffer, "initial");
      for(i = 0; i < vInitial.dim(); ++i){
	sprintf(buffer + strlen(buffer), " %g", vInitial[i]);
      }
      ds.PutF(NULL, "%s", buffer);
      delete[] buffer;
    }
    break;
  }
}